

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

void __thiscall
wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::setLocalValue
          (ConstantExpressionRunner<wasm::CExpressionRunner> *this,Index index,Literals *values)

{
  mapped_type *pmVar1;
  key_type local_24 [2];
  Index index_local;
  
  if (((long)(values->super_SmallVector<wasm::Literal,_1UL>).flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(values->super_SmallVector<wasm::Literal,_1UL>).flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
      (values->super_SmallVector<wasm::Literal,_1UL>).usedFixed != 0) {
    pmVar1 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->localValues,local_24);
    (pmVar1->super_SmallVector<wasm::Literal,_1UL>).usedFixed =
         (values->super_SmallVector<wasm::Literal,_1UL>).usedFixed;
    Literal::operator=((pmVar1->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                       (values->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator=
              (&(pmVar1->super_SmallVector<wasm::Literal,_1UL>).flexible,
               &(values->super_SmallVector<wasm::Literal,_1UL>).flexible);
    return;
  }
  __assert_fail("values.isConcrete()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                ,0x80a,
                "void wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::setLocalValue(Index, Literals &) [SubType = wasm::CExpressionRunner]"
               );
}

Assistant:

void setLocalValue(Index index, Literals& values) {
    assert(values.isConcrete());
    localValues[index] = values;
  }